

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnHelper::WriteColumns
          (ColumnHelper *this,idx_t start_index,idx_t start_col,idx_t end_col,DataChunk *output)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined4 extraout_var;
  string *psVar5;
  idx_t val;
  long lVar6;
  undefined4 extraout_var_00;
  LogicalType *this_00;
  LogicalType *this_01;
  Value numeric_precision;
  Value numeric_precision_radix;
  Value numeric_scale;
  Value local_1d0;
  LogicalType local_190;
  LogicalType local_178;
  LogicalType local_160;
  LogicalType local_148;
  LogicalType local_130;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  long lVar4;
  undefined4 extraout_var_01;
  
  do {
    if (end_col <= start_col) {
      return;
    }
    iVar3 = (*this->_vptr_ColumnHelper[2])(this);
    lVar4 = CONCAT44(extraout_var,iVar3);
    psVar5 = Catalog::GetName_abi_cxx11_(*(Catalog **)(lVar4 + 0xd8));
    ::std::__cxx11::string::string((string *)&local_98,(string *)psVar5);
    Value::Value(&numeric_precision,&local_98);
    DataChunk::SetValue(output,0,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::~string((string *)&local_98);
    val = Catalog::GetOid(*(Catalog **)(lVar4 + 0xd8));
    lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(val);
    Value::BIGINT(&numeric_precision,lVar6);
    DataChunk::SetValue(output,1,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::string((string *)&local_b8,(string *)(*(long *)(lVar4 + 0xe0) + 0x20));
    Value::Value(&numeric_precision,&local_b8);
    DataChunk::SetValue(output,2,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::~string((string *)&local_b8);
    lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      (*(unsigned_long *)(*(long *)(lVar4 + 0xe0) + 8));
    Value::BIGINT(&numeric_precision,lVar6);
    DataChunk::SetValue(output,3,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::string((string *)&local_d8,(string *)(lVar4 + 0x20));
    Value::Value(&numeric_precision,&local_d8);
    DataChunk::SetValue(output,4,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::~string((string *)&local_d8);
    lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(*(unsigned_long *)(lVar4 + 8));
    Value::BIGINT(&numeric_precision,lVar6);
    DataChunk::SetValue(output,5,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    iVar3 = (*this->_vptr_ColumnHelper[4])(this,start_col);
    ::std::__cxx11::string::string((string *)&local_f8,(string *)CONCAT44(extraout_var_00,iVar3));
    Value::Value(&numeric_precision,&local_f8);
    DataChunk::SetValue(output,6,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::~string((string *)&local_f8);
    Value::INTEGER(&numeric_precision,(int)start_col + 1);
    DataChunk::SetValue(output,7,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    (*this->_vptr_ColumnHelper[8])(&numeric_precision,this,start_col);
    DataChunk::SetValue(output,8,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    Value::BOOLEAN(&numeric_precision,*(bool *)(lVar4 + 0x42));
    DataChunk::SetValue(output,9,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    (*this->_vptr_ColumnHelper[6])(&numeric_precision,this,start_col);
    DataChunk::SetValue(output,10,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    iVar3 = (*this->_vptr_ColumnHelper[7])(this,start_col);
    Value::BOOLEAN(&numeric_precision,SUB41(iVar3,0));
    DataChunk::SetValue(output,0xb,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    iVar3 = (*this->_vptr_ColumnHelper[5])(this,start_col);
    this_00 = (LogicalType *)CONCAT44(extraout_var_01,iVar3);
    LogicalType::ToString_abi_cxx11_(&local_118,this_00);
    Value::Value(&numeric_precision,&local_118);
    DataChunk::SetValue(output,0xc,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    ::std::__cxx11::string::~string((string *)&local_118);
    Value::BIGINT(&numeric_precision,(ulong)this_00->id_);
    DataChunk::SetValue(output,0xd,start_index,&numeric_precision);
    Value::~Value(&numeric_precision);
    LogicalType::LogicalType(&numeric_precision.type_,VARCHAR);
    bVar1 = LogicalType::operator==(this_00,&numeric_precision.type_);
    LogicalType::~LogicalType(&numeric_precision.type_);
    if (bVar1) {
      LogicalType::LogicalType(&local_130,SQLNULL);
      Value::Value(&numeric_precision,&local_130);
      DataChunk::SetValue(output,0xe,start_index,&numeric_precision);
      Value::~Value(&numeric_precision);
      this_01 = &local_130;
    }
    else {
      LogicalType::LogicalType(&local_148,SQLNULL);
      Value::Value(&numeric_precision,&local_148);
      DataChunk::SetValue(output,0xe,start_index,&numeric_precision);
      Value::~Value(&numeric_precision);
      this_01 = &local_148;
    }
    LogicalType::~LogicalType(this_01);
    LogicalType::LogicalType(&local_160,SQLNULL);
    Value::Value(&numeric_precision,&local_160);
    LogicalType::~LogicalType(&local_160);
    LogicalType::LogicalType(&local_48,SQLNULL);
    Value::Value(&numeric_scale,&local_48);
    LogicalType::~LogicalType(&local_48);
    LogicalType::LogicalType(&local_60,SQLNULL);
    Value::Value(&numeric_precision_radix,&local_60);
    LogicalType::~LogicalType(&local_60);
    switch(this_00->id_) {
    case TINYINT:
      Value::INTEGER(&local_1d0,8);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
      break;
    case SMALLINT:
      Value::INTEGER(&local_1d0,0x10);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
      break;
    case INTEGER:
      Value::INTEGER(&local_1d0,0x20);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
      break;
    case BIGINT:
      Value::INTEGER(&local_1d0,0x40);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
      break;
    case DATE:
    case TIME:
    case TIMESTAMP_SEC:
    case TIMESTAMP_MS:
    case TIMESTAMP:
    case TIMESTAMP_NS:
switchD_0187c028_caseD_f:
      LogicalType::LogicalType(&local_178,SQLNULL);
      Value::Value(&local_1d0,&local_178);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      LogicalType::~LogicalType(&local_178);
      LogicalType::LogicalType(&local_190,SQLNULL);
      Value::Value(&local_1d0,&local_190);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      LogicalType::~LogicalType(&local_190);
      LogicalType::LogicalType(&local_78,SQLNULL);
      Value::Value(&local_1d0,&local_78);
      Value::operator=(&numeric_precision_radix,&local_1d0);
      Value::~Value(&local_1d0);
      LogicalType::~LogicalType(&local_78);
      goto LAB_0187c3f1;
    case DECIMAL:
      bVar2 = DecimalType::GetWidth(this_00);
      Value::INTEGER(&local_1d0,(uint)bVar2);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      bVar2 = DecimalType::GetScale(this_00);
      Value::INTEGER(&local_1d0,(uint)bVar2);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,10);
      break;
    case FLOAT:
      Value::INTEGER(&local_1d0,0x18);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
      break;
    case DOUBLE:
      Value::INTEGER(&local_1d0,0x35);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
      break;
    default:
      if (this_00->id_ != HUGEINT) goto switchD_0187c028_caseD_f;
      Value::INTEGER(&local_1d0,0x80);
      Value::operator=(&numeric_precision,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,0);
      Value::operator=(&numeric_scale,&local_1d0);
      Value::~Value(&local_1d0);
      Value::INTEGER(&local_1d0,2);
    }
    Value::operator=(&numeric_precision_radix,&local_1d0);
    Value::~Value(&local_1d0);
LAB_0187c3f1:
    DataChunk::SetValue(output,0xf,start_index,&numeric_precision);
    DataChunk::SetValue(output,0x10,start_index,&numeric_precision_radix);
    DataChunk::SetValue(output,0x11,start_index,&numeric_scale);
    Value::~Value(&numeric_precision_radix);
    Value::~Value(&numeric_scale);
    Value::~Value(&numeric_precision);
    start_index = start_index + 1;
    start_col = start_col + 1;
  } while( true );
}

Assistant:

void ColumnHelper::WriteColumns(idx_t start_index, idx_t start_col, idx_t end_col, DataChunk &output) {
	for (idx_t i = start_col; i < end_col; i++) {
		auto index = start_index + (i - start_col);
		auto &entry = Entry();

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, index, entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.catalog.GetOid())));
		// schema_name, VARCHAR
		output.SetValue(col++, index, entry.schema.name);
		// schema_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.schema.oid)));
		// table_name, VARCHAR
		output.SetValue(col++, index, entry.name);
		// table_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.oid)));
		// column_name, VARCHAR
		output.SetValue(col++, index, Value(ColumnName(i)));
		// column_index, INTEGER
		output.SetValue(col++, index, Value::INTEGER(UnsafeNumericCast<int32_t>(i + 1)));
		// comment, VARCHAR
		output.SetValue(col++, index, ColumnComment(i));
		// internal, BOOLEAN
		output.SetValue(col++, index, Value::BOOLEAN(entry.internal));
		// column_default, VARCHAR
		output.SetValue(col++, index, Value(ColumnDefault(i)));
		// is_nullable, BOOLEAN
		output.SetValue(col++, index, Value::BOOLEAN(IsNullable(i)));
		// data_type, VARCHAR
		const LogicalType &type = ColumnType(i);
		output.SetValue(col++, index, Value(type.ToString()));
		// data_type_id, BIGINT
		output.SetValue(col++, index, Value::BIGINT(int(type.id())));
		if (type == LogicalType::VARCHAR) {
			// FIXME: need check constraints in place to set this correctly
			// character_maximum_length, INTEGER
			output.SetValue(col++, index, Value());
		} else {
			// "character_maximum_length", PhysicalType::INTEGER
			output.SetValue(col++, index, Value());
		}

		Value numeric_precision, numeric_scale, numeric_precision_radix;
		switch (type.id()) {
		case LogicalTypeId::DECIMAL:
			numeric_precision = Value::INTEGER(DecimalType::GetWidth(type));
			numeric_scale = Value::INTEGER(DecimalType::GetScale(type));
			numeric_precision_radix = Value::INTEGER(10);
			break;
		case LogicalTypeId::HUGEINT:
			numeric_precision = Value::INTEGER(128);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::BIGINT:
			numeric_precision = Value::INTEGER(64);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::INTEGER:
			numeric_precision = Value::INTEGER(32);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::SMALLINT:
			numeric_precision = Value::INTEGER(16);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::TINYINT:
			numeric_precision = Value::INTEGER(8);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::FLOAT:
			numeric_precision = Value::INTEGER(24);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::DOUBLE:
			numeric_precision = Value::INTEGER(53);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		default:
			numeric_precision = Value();
			numeric_scale = Value();
			numeric_precision_radix = Value();
			break;
		}

		// numeric_precision, INTEGER
		output.SetValue(col++, index, numeric_precision);
		// numeric_precision_radix, INTEGER
		output.SetValue(col++, index, numeric_precision_radix);
		// numeric_scale, INTEGER
		output.SetValue(col++, index, numeric_scale);
	}
}